

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defopcode.c
# Opt level: O0

void compute_optimal_shifts
               (ParsedOpcodeInfo *info,int *shift,List *isect_list,int literal_bits,
               int literal_bits_mask)

{
  bool bVar1;
  BOOL BVar2;
  uint uVar3;
  uint local_48;
  int cbits;
  int changing_bits;
  int known_pattern;
  CCVariant *var;
  int i;
  BOOL first;
  int m68kop;
  int literal_bits_mask_local;
  int literal_bits_local;
  List *isect_list_local;
  int *shift_local;
  ParsedOpcodeInfo *info_local;
  
  bVar1 = true;
  local_48 = 0;
  cbits = 0;
  for (i = 0; i < 0x10000; i = i + 1) {
    if ((((i & literal_bits_mask) == literal_bits) && (map_index[i] == 0)) &&
       (BVar2 = is_member_of_set((unsigned_short)i,isect_list), BVar2 != FALSE)) {
      if (bVar1) {
        cbits = i;
        bVar1 = false;
      }
      else {
        local_48 = cbits ^ i | local_48;
      }
    }
  }
  var._4_4_ = 0;
  for (_changing_bits = info->cc_variant; _changing_bits != (CCVariant *)0x0;
      _changing_bits = _changing_bits->next) {
    uVar3 = compute_dashmask(_changing_bits->bits_to_expand);
    uVar3 = (uVar3 ^ 0xffffffff) & local_48;
    if (uVar3 == 0) {
      shift[var._4_4_] = 0;
    }
    else {
      shift[var._4_4_] = 0;
      while (((int)uVar3 >> ((byte)shift[var._4_4_] & 0x1f) & 1U) == 0) {
        shift[var._4_4_] = shift[var._4_4_] + 1;
      }
    }
    var._4_4_ = var._4_4_ + 1;
  }
  return;
}

Assistant:

static void
compute_optimal_shifts (const ParsedOpcodeInfo *info, int *shift,
			List *isect_list, int literal_bits,
			int literal_bits_mask)
{
  int m68kop;
  BOOL first = TRUE;
  int i;
  const CCVariant *var;
  int known_pattern, changing_bits = 0;

  /* Determine which bits in the 68k opcode can take on different values. */
  known_pattern = 0;
  for (m68kop = 0; m68kop < 65536; m68kop++)
    {
      if ((m68kop & literal_bits_mask) == literal_bits
	  && map_index[m68kop] == NO_MAP
	  && is_member_of_set (m68kop, isect_list))
	{
	  if (first)
	    {
	      known_pattern = m68kop;
	      first = FALSE;
	    }
	  else
	    changing_bits |= known_pattern ^ m68kop;
	}
    }
  
  /* Determine optimal shift count for each cc variant by locating the lowest
   * 68k opcode bit used in the 68k->synthetic translation which can take on
   * different values.
   */
  for (i = 0, var = info->cc_variant; var != NULL; i++, var = var->next)
    {
      int cbits = changing_bits;
      
      /* Recommend we shift out all '-'s in the bits_to_expand. */
      cbits &= ~compute_dashmask (var->bits_to_expand);
      
      /* Compute good shift count based on lowest changing bit. */
      if (cbits == 0)  /* If no bits change, don't bother shifting. */
	shift[i] = 0;
      else  /* Shift until lowest changing bit is in lsb position. */
	for (shift[i] = 0; !((cbits >> shift[i]) & 1); shift[i]++)
	  ;
    }
}